

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

RC __thiscall QO_Manager::Compute(QO_Manager *this,QO_Rel *relOrder,float *costEst,float *tupleEst)

{
  int iVar1;
  pointer pmVar2;
  bool bVar3;
  RC RVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  mapped_type *ppcVar8;
  _Base_ptr p_Var9;
  uint *puVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint *puVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  uint uVar20;
  long lVar21;
  float *pfVar22;
  float *pfVar23;
  vector<int,_std::allocator<int>_> allNewSubsets;
  vector<int,_std::allocator<int>_> allSubsets;
  RC local_90;
  uint local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  float *local_40;
  float *local_38;
  
  RVar4 = InitializeBaseCases(this);
  if (RVar4 == 0) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    uVar20 = this->nRels;
    if ((int)uVar20 < 1) {
      uVar6 = 0;
      pfVar22 = tupleEst;
      pfVar23 = costEst;
    }
    else {
      iVar12 = 0;
      local_38 = costEst;
      do {
        if (iVar12 == 0x21) {
          RVar4 = 0x19b;
          goto LAB_00114dad;
        }
        iVar5 = 1 << ((byte)iVar12 & 0x1f);
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar5);
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_78);
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar12 = iVar12 + 1;
        uVar20 = this->nRels;
        uVar7 = (ulong)uVar20;
      } while (iVar12 < (int)uVar20);
      local_40 = tupleEst;
      if (1 < (int)uVar20) {
        lVar21 = 1;
        do {
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          puVar10 = (uint *)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
          puVar14 = (uint *)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start !=
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            do {
              if (0 < (int)uVar7) {
                uVar20 = 0;
                do {
                  uVar6 = 1 << ((byte)uVar20 & 0x1f);
                  local_7c = uVar6;
                  if (0x20 < uVar20) {
                    local_7c = 0;
                  }
                  local_7c = local_7c | *puVar14;
                  pmVar2 = (this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  p_Var15 = &pmVar2[lVar21 + -1]._M_t._M_impl.super__Rb_tree_header._M_header;
                  p_Var18 = *(_Base_ptr *)
                             ((long)&pmVar2[lVar21 + -1]._M_t._M_impl.super__Rb_tree_header + 8);
                  p_Var16 = p_Var15;
                  p_Var17 = p_Var15;
                  if (p_Var18 != (_Base_ptr)0x0) {
                    do {
                      if ((int)local_7c <= (int)p_Var18[1]._M_color) {
                        p_Var17 = p_Var18;
                      }
                      p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < (int)local_7c];
                    } while (p_Var18 != (_Base_ptr)0x0);
                    if ((p_Var17 != p_Var15) &&
                       (p_Var16 = p_Var17, (int)local_7c < (int)p_Var17[1]._M_color)) {
                      p_Var16 = p_Var15;
                    }
                  }
                  p_Var18 = *(_Base_ptr *)
                             ((long)&pmVar2[lVar21]._M_t._M_impl.super__Rb_tree_header + 8);
                  p_Var9 = &pmVar2[lVar21]._M_t._M_impl.super__Rb_tree_header._M_header;
                  p_Var17 = p_Var9;
                  p_Var19 = p_Var9;
                  if (p_Var18 != (_Base_ptr)0x0) {
                    do {
                      if ((int)local_7c <= (int)p_Var18[1]._M_color) {
                        p_Var17 = p_Var18;
                      }
                      p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < (int)local_7c];
                    } while (p_Var18 != (_Base_ptr)0x0);
                    if ((p_Var17 != p_Var9) &&
                       (p_Var19 = p_Var17, (int)local_7c < (int)p_Var17[1]._M_color)) {
                      p_Var19 = p_Var9;
                    }
                  }
                  if ((((uVar20 < 0x21) && ((*puVar14 & uVar6) == 0)) && (p_Var16 == p_Var15)) &&
                     (p_Var19 == p_Var9)) {
                    RVar4 = CalculateOptJoin(this,local_7c,(int)lVar21);
                    if (RVar4 != 0) {
                      bVar3 = false;
                      goto LAB_00114c1a;
                    }
                    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_78,
                                 (iterator)
                                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(int *)&local_7c);
                    }
                    else {
                      *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_7c;
                      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  uVar20 = uVar20 + 1;
                  uVar7 = (ulong)(uint)this->nRels;
                  puVar10 = (uint *)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish;
                } while ((int)uVar20 < this->nRels);
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar10);
            if (puVar10 !=
                (uint *)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) {
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            }
          }
          bVar3 = true;
          std::vector<int,_std::allocator<int>_>::operator=(&local_58,&local_78);
          RVar4 = local_90;
LAB_00114c1a:
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (!bVar3) goto LAB_00114dad;
          lVar21 = lVar21 + 1;
          uVar20 = this->nRels;
          uVar7 = (ulong)(int)uVar20;
          local_90 = RVar4;
        } while (lVar21 < (long)uVar7);
      }
      pfVar22 = local_40;
      pfVar23 = local_38;
      if ((int)uVar20 < 1) {
        uVar6 = 0;
      }
      else {
        uVar11 = 0;
        uVar6 = 0;
        do {
          if (uVar11 == 0x21) {
            RVar4 = 0x19b;
            goto LAB_00114dad;
          }
          uVar6 = uVar6 | 1 << (uVar11 & 0x1f);
          uVar11 = uVar11 + 1;
        } while (uVar20 != uVar11);
      }
    }
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,uVar6);
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar20 + -1,
                           (key_type *)&local_78);
    *pfVar23 = (*ppcVar8)->cost;
    ppcVar8 = std::
              map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
              ::operator[]((this->optcost).
                           super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)this->nRels + -1,
                           (key_type *)&local_78);
    *pfVar22 = (*ppcVar8)->numTuples;
    iVar12 = this->nRels;
    if (0 < iVar12) {
      iVar5 = 0;
      iVar13 = -1;
      do {
        iVar12 = iVar12 + iVar13;
        ppcVar8 = std::
                  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                  ::operator[]((this->optcost).
                               super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar12,
                               (key_type *)&local_78);
        iVar1 = (*ppcVar8)->joins;
        ppcVar8 = std::
                  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                  ::operator[]((this->optcost).
                               super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar12,
                               (key_type *)&local_78);
        relOrder[iVar12].relIdx = (*ppcVar8)->newRelIndex;
        ppcVar8 = std::
                  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                  ::operator[]((this->optcost).
                               super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar12,
                               (key_type *)&local_78);
        relOrder[iVar12].indexAttr = (*ppcVar8)->indexAttr;
        ppcVar8 = std::
                  map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
                  ::operator[]((this->optcost).
                               super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar12,
                               (key_type *)&local_78);
        relOrder[iVar12].indexCond = (*ppcVar8)->indexCond;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,iVar1);
        iVar5 = iVar5 + 1;
        iVar12 = this->nRels;
        iVar13 = iVar13 + -1;
      } while (iVar5 < iVar12);
    }
    RVar4 = 0;
LAB_00114dad:
    if ((uint *)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return RVar4;
}

Assistant:

RC QO_Manager::Compute(QO_Rel *relOrder, float &costEst, float &tupleEst){
  RC rc = 0;
  // initialize the base relations
  if((rc = InitializeBaseCases()))
    return (rc);

  // create a vector containing bitmaps that
  // reflect all subsets of size 1
  vector<int> allSubsets;
  for(int i=0; i < nRels; i++){
    int bitmap = 0;
    if((rc = AddRelToBitmap(i, bitmap)))
      return (rc);
    allSubsets.push_back(bitmap);
  }

  for(int i=1; i < nRels; i++){ // for all sizes of subsets
    vector<int> allNewSubsets; // will hold all subsets of size i+1
                               // at the end of the iteration
    // iterate through all sets of the previous size
    vector<int>::iterator it;
    for(it= allSubsets.begin(); it != allSubsets.end(); ++it){
      for(int j=0; j < nRels; j++){ // go through all ways of adding a new relation
        int relsInJoin = *it;
        int newRelsInJoin = relsInJoin;
        AddRelToBitmap(j, newRelsInJoin);
        bool isInOptCost1 = (optcost[i-1].find(newRelsInJoin) != optcost[i-1].end());
        bool isInOptCost2 = (optcost[i].find(newRelsInJoin) != optcost[i].end());
        // If adding this new relation modifies the set (i.e. relation is not)
        // included in the set of the previous size) and we haven't calculated
        // the optimal way of joining this yet, do so
        if(!IsBitSet(j, relsInJoin) && !isInOptCost1 && !isInOptCost2){
          if((rc = CalculateOptJoin(newRelsInJoin, i))){
            return (rc);
          }
          // add this to the set.
          allNewSubsets.push_back(newRelsInJoin);
        }
      }
    }
    allSubsets.clear();
    allSubsets = allNewSubsets;
    // set the previous set of joins of size i to the set of joins
    // of size i+1
  }

  // create the bitmap containing all relations
  int relsInJoin = 0;
  for(int i = 0; i < nRels; i++){
    if((rc = AddRelToBitmap(i, relsInJoin)))
      return (rc);
  }
  // update the overall estimated costs and tuple numbers
  costEst = optcost[nRels-1][relsInJoin]->cost;
  tupleEst = optcost[nRels-1][relsInJoin]->numTuples;
  // backtrace: start with the set of all relations, and use the
  // "joins" field to get the cost stats of the previous opt join, and
  // move them to the appropriate location in QO_Rel array
  for(int i=0; i < nRels; i++){
    int index = nRels-i-1;
    int nextSubJoin = optcost[index][relsInJoin]->joins;
    relOrder[index].relIdx = optcost[index][relsInJoin]->newRelIndex;
    relOrder[index].indexAttr = optcost[index][relsInJoin]->indexAttr;
    relOrder[index].indexCond = optcost[index][relsInJoin]->indexCond;
    relsInJoin = nextSubJoin;
  }

  return (0);
}